

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

uint8_t __thiscall nuraft::buffer_serializer::get_u8(buffer_serializer *this)

{
  bool bVar1;
  overflow_error *this_00;
  byte *pbVar2;
  buffer_serializer *in_RDI;
  uint8_t *ptr;
  uint8_t ret;
  buffer_serializer *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  uint8_t uVar3;
  
  bVar1 = is_valid(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar2 = nuraft::buffer::data_begin(in_RDI->buf_);
  uVar3 = pbVar2[in_RDI->pos_];
  pos(in_RDI);
  pos((buffer_serializer *)CONCAT17(uVar3,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return uVar3;
}

Assistant:

uint8_t buffer_serializer::get_u8() {
    uint8_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    ret = ptr[0];
    pos( pos() + sizeof(ret) );
    return ret;
}